

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O2

Vec_Int_t * Gia_ManEdgeToArray(Gia_Man_t *p)

{
  uint __line;
  int iVar1;
  Vec_Int_t *p_00;
  int i;
  char *__assertion;
  
  p_00 = Vec_IntAlloc(1000);
  if ((p->vEdge1 == (Vec_Int_t *)0x0) || (p->vEdge2 == (Vec_Int_t *)0x0)) {
    __assertion = "p->vEdge1 && p->vEdge2";
    __line = 0x5c;
  }
  else {
    iVar1 = p->vEdge1->nSize;
    if (iVar1 == p->nObjs) {
      if (p->vEdge2->nSize == iVar1) {
        for (i = 0; i < iVar1; i = i + 1) {
          iVar1 = Vec_IntEntry(p->vEdge1,i);
          if (iVar1 < i && iVar1 != 0) {
            Vec_IntPushTwo(p_00,iVar1,i);
          }
          iVar1 = Vec_IntEntry(p->vEdge2,i);
          if (iVar1 < i && iVar1 != 0) {
            Vec_IntPushTwo(p_00,iVar1,i);
          }
          iVar1 = p->nObjs;
        }
        return p_00;
      }
      __assertion = "Vec_IntSize(p->vEdge2) == Gia_ManObjNum(p)";
      __line = 0x5e;
    }
    else {
      __assertion = "Vec_IntSize(p->vEdge1) == Gia_ManObjNum(p)";
      __line = 0x5d;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                ,__line,"Vec_Int_t *Gia_ManEdgeToArray(Gia_Man_t *)");
}

Assistant:

Vec_Int_t * Gia_ManEdgeToArray( Gia_Man_t * p )
{
    int iObj, iFanin;
    Vec_Int_t * vArray = Vec_IntAlloc( 1000 );
    assert( p->vEdge1 && p->vEdge2 );
    assert( Vec_IntSize(p->vEdge1) == Gia_ManObjNum(p) );
    assert( Vec_IntSize(p->vEdge2) == Gia_ManObjNum(p) );
    for ( iObj = 0; iObj < Gia_ManObjNum(p); iObj++ )
    {
        iFanin = Vec_IntEntry( p->vEdge1, iObj );
        if ( iFanin && iFanin < iObj )
            Vec_IntPushTwo( vArray, iFanin, iObj );
        iFanin = Vec_IntEntry( p->vEdge2, iObj );
        if ( iFanin && iFanin < iObj )
            Vec_IntPushTwo( vArray, iFanin, iObj );
    }
    return vArray;
}